

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool __thiscall
gguf_reader::read<unsigned_int>
          (gguf_reader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *dst,size_t n)

{
  bool bVar1;
  uint *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t i;
  uint *dst_00;
  uint *local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(in_RDI,(size_type)in_RSI);
  local_28 = (uint *)0x0;
  while( true ) {
    dst_00 = local_28;
    puVar2 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    if (puVar2 <= dst_00) {
      return true;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,(size_type)local_28)
    ;
    bVar1 = read<unsigned_int>((gguf_reader *)in_RDI,dst_00);
    if (!bVar1) break;
    local_28 = (uint *)((long)local_28 + 1);
  }
  return false;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }